

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

NULLCArray NULLCTypeInfo::TypeName(int *type)

{
  FastVector<ExternTypeInfo,_false,_false> *this;
  uint uVar1;
  char *pcVar2;
  ExternTypeInfo *pEVar3;
  size_t sVar4;
  NULLCArray NVar5;
  
  if (linker != 0) {
    this = (FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200);
    pcVar2 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),0);
    pEVar3 = FastVector<ExternTypeInfo,_false,_false>::operator[](this,*type);
    uVar1 = pEVar3->offsetToName;
    sVar4 = strlen(pcVar2 + uVar1);
    NVar5.len = (int)sVar4 + 1;
    NVar5.ptr = pcVar2 + uVar1;
    return NVar5;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xbb,"NULLCArray NULLCTypeInfo::TypeName(int *)");
}

Assistant:

NULLCArray TypeName(int* type)
	{
		assert(linker);
		NULLCArray ret;
		FastVector<ExternTypeInfo> &exTypes = linker->exTypes;
		char *symbols = &linker->exSymbols[0];

		ret.ptr = exTypes[*type].offsetToName + symbols;
		ret.len = (unsigned int)strlen(ret.ptr) + 1;
		return ret;
	}